

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_array_slice_Test::TestBody(expr_array_slice_Test *this)

{
  int iVar1;
  Generator *pGVar2;
  Var *pVVar3;
  undefined4 extraout_var;
  long *plVar4;
  char *pcVar5;
  undefined1 local_6d0 [8];
  Generator mod;
  Context c;
  allocator<char> local_28 [8];
  AssertionResult gtest_ar;
  
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"mod",local_28);
  pGVar2 = kratos::Context::generator
                     ((Context *)&mod.use_stmts_remove_cache_,
                      (string *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::Generator((Generator *)local_6d0,pGVar2);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"t",local_28);
  pVVar3 = kratos::Generator::var
                     ((Generator *)local_6d0,(string *)&c.tracked_generators_._M_h._M_single_bucket,
                      4,3,false);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  iVar1 = (*(pVVar3->super_IRNode)._vptr_IRNode[9])(pVVar3,2);
  plVar4 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*plVar4 + 0xf8))(&c.tracked_generators_._M_h._M_single_bucket,plVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_28,"slice0.to_string()","\"t[2]\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &c.tracked_generators_._M_h._M_single_bucket,(char (*) [5])"t[2]");
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  if (local_28[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&c.tracked_generators_._M_h._M_single_bucket);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xda,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)&c.tracked_generators_._M_h._M_single_bucket);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (c.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (*(code *)(c.tracked_generators_._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x48))(plVar4,0);
  (**(code **)(*plVar4 + 0xf8))(&c.tracked_generators_._M_h._M_single_bucket,plVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)local_28,"slice0[0].to_string()","\"t[2][0]\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &c.tracked_generators_._M_h._M_single_bucket,(char (*) [8])"t[2][0]");
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  if (local_28[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&c.tracked_generators_._M_h._M_single_bucket);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xdb,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)&c.tracked_generators_._M_h._M_single_bucket);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (c.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (*(code *)(c.tracked_generators_._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::Generator::~Generator((Generator *)local_6d0);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, array_slice) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto &array0 = mod.var("t", 4, 3, false);
    auto &slice0 = array0[2];
    EXPECT_EQ(slice0.to_string(), "t[2]");
    EXPECT_EQ(slice0[0].to_string(), "t[2][0]");
}